

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

axbStatus_t op_vec_axpy(axbVec_s *y,axbScalar_s *alpha,axbVec_s *x,void *aux_data)

{
  void *pvVar1;
  double *pdVar2;
  void *pvVar3;
  ulong local_48;
  size_t i;
  double *d_x;
  double *d_alpha;
  double *d_y;
  void *aux_data_local;
  axbVec_s *x_local;
  axbScalar_s *alpha_local;
  axbVec_s *y_local;
  
  pvVar1 = y->data;
  pdVar2 = (double *)alpha->data;
  pvVar3 = x->data;
  for (local_48 = 0; local_48 < y->size; local_48 = local_48 + 1) {
    *(double *)((long)pvVar1 + local_48 * 8) =
         *pdVar2 * *(double *)((long)pvVar3 + local_48 * 8) +
         *(double *)((long)pvVar1 + local_48 * 8);
  }
  return 0;
}

Assistant:

static axbStatus_t op_vec_axpy(struct axbVec_s *y, const struct axbScalar_s *alpha, const struct axbVec_s *x, void *aux_data)
{
  (void)aux_data;

        double *d_y     =       (double*)y->data;
  const double *d_alpha = (const double*)alpha->data;
  const double *d_x     = (const double*)x->data;

  for (size_t i=0; i<y->size; ++i) d_y[i] += *d_alpha * d_x[i];

  return 0;
}